

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O1

void __thiscall CVmObjGramProd::build_alt_props(CVmObjGramProd *this,vm_obj_id_t match_obj)

{
  size_t element_count;
  CVmObjList *lst;
  vm_val_t lstval;
  undefined4 local_40 [2];
  vm_obj_id_t local_38;
  
  if (G_predef_X.gramprod_alt_props != 0) {
    element_count = build_alt_props_list(this,match_obj,(CVmObjList *)0x0);
    local_38 = CVmObjList::create(0,element_count);
    local_40[0] = 5;
    lst = (CVmObjList *)
          ((long)&G_obj_table_X.pages_[local_38 >> 0xc]->ptr_ + (ulong)((local_38 & 0xfff) * 0x18));
    build_alt_props_list(this,match_obj,lst);
    CVmObjList::cons_uniquify(lst);
    (**(code **)(*(long *)&G_obj_table_X.pages_[match_obj >> 0xc][match_obj & 0xfff].ptr_ + 0x60))
              (G_obj_table_X.pages_[match_obj >> 0xc] + (match_obj & 0xfff),G_undo_X,match_obj,
               G_predef_X.gramprod_alt_props,local_40);
  }
  return;
}

Assistant:

void CVmObjGramProd::build_alt_props(VMG_ vm_obj_id_t match_obj)
{
    /* if there's no grammarAltProps property export, skip this */
    if (G_predef->gramprod_alt_props == VM_INVALID_PROP)
        return;

    /* first do a scan without an output list to count the properties */
    size_t cnt = build_alt_props_list(vmg_ match_obj, 0);

    /* create the list */
    vm_val_t lstval;
    lstval.set_obj(CVmObjList::create(vmg_ FALSE, cnt));
    CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ lstval.val.obj);

    /* build the list */
    build_alt_props_list(vmg_ match_obj, lst);

    /* keep only unique properties in the list */
    lst->cons_uniquify(vmg0_);

    /* store it in the match object under grammarAltProps */
    vm_objp(vmg_ match_obj)->set_prop(
        vmg_ G_undo, match_obj, G_predef->gramprod_alt_props, &lstval);
}